

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O0

int nn_xpush_create(void *hint,nn_sockbase **sockbase)

{
  nn_xpush *self_00;
  nn_xpush *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_xpush *)nn_alloc_(0x198);
  if (self_00 == (nn_xpush *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
            ,0xba);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpush_init(self_00,&nn_xpush_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

int nn_xpush_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpush *self;

    self = nn_alloc (sizeof (struct nn_xpush), "socket (push)");
    alloc_assert (self);
    nn_xpush_init (self, &nn_xpush_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}